

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

XMLText * __thiscall tinyxml2::XMLDocument::NewText(XMLDocument *this,char *str)

{
  XMLText *this_00;
  XMLText *text;
  char *str_local;
  XMLDocument *this_local;
  
  this_00 = CreateUnlinkedNode<tinyxml2::XMLText,112>(this,&this->_textPool);
  XMLNode::SetValue(&this_00->super_XMLNode,str,false);
  return this_00;
}

Assistant:

XMLText* XMLDocument::NewText(const char* str)
{
    XMLText* text = CreateUnlinkedNode<XMLText>(_textPool);
    text->SetValue(str);
    return text;
}